

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall el::base::LogFormat::~LogFormat(LogFormat *this)

{
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_0012d2b0;
  std::__cxx11::string::~string((string *)&this->m_currentHost);
  std::__cxx11::string::~string((string *)&this->m_currentUser);
  std::__cxx11::string::~string((string *)&this->m_dateTimeFormat);
  std::__cxx11::string::~string((string *)&this->m_format);
  std::__cxx11::string::~string((string *)&this->m_userFormat);
  return;
}

Assistant:

virtual ~LogFormat(void) {}